

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callgrind_converter.cpp
# Opt level: O3

void __thiscall
HawkTracer::client::CallgrindConverter::process_event(CallgrindConverter *this,Event *event)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  const_iterator cVar3;
  vector<HawkTracer::client::CallGraph::NodeData,std::allocator<HawkTracer::client::CallGraph::NodeData>>
  *this_00;
  HT_ThreadId thread_id;
  HT_DurationNs duration;
  HT_TimestampNs start_ts;
  string label;
  uint local_74;
  key_type local_70;
  ulong local_50;
  unsigned_long local_48;
  string local_40;
  
  Converter::_get_label_abi_cxx11_(&local_40,&this->super_Converter,event);
  iVar2 = std::__cxx11::string::compare((char *)&local_40);
  if (iVar2 != 0) {
    paVar1 = &local_70.field_2;
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"thread_id","");
    cVar3 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)event,&local_70);
    if (cVar3.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>,_true>
        ._M_cur == (__node_type *)0x0) {
      local_74 = 0;
    }
    else {
      local_74 = HawkTracer::parser::Event::get_value<unsigned_int>((string *)event);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    local_48 = *(unsigned_long *)(event + 0x48);
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"duration","");
    cVar3 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)event,&local_70);
    if (cVar3.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>,_true>
        ._M_cur == (__node_type *)0x0) {
      local_50 = 0;
    }
    else {
      local_50 = HawkTracer::parser::Event::get_value<unsigned_long>((string *)event);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    this_00 = (vector<HawkTracer::client::CallGraph::NodeData,std::allocator<HawkTracer::client::CallGraph::NodeData>>
               *)std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<HawkTracer::client::CallGraph::NodeData,_std::allocator<HawkTracer::client::CallGraph::NodeData>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<HawkTracer::client::CallGraph::NodeData,_std::allocator<HawkTracer::client::CallGraph::NodeData>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<HawkTracer::client::CallGraph::NodeData,_std::allocator<HawkTracer::client::CallGraph::NodeData>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<HawkTracer::client::CallGraph::NodeData,_std::allocator<HawkTracer::client::CallGraph::NodeData>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->_events,&local_74);
    std::
    vector<HawkTracer::client::CallGraph::NodeData,std::allocator<HawkTracer::client::CallGraph::NodeData>>
    ::emplace_back<std::__cxx11::string&,unsigned_long&,unsigned_long&>
              (this_00,&local_40,&local_48,&local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CallgrindConverter::process_event(const parser::Event& event)
{
    std::string label = _get_label(event);

    if (label == "")
    {
        return;
    }
    HT_ThreadId thread_id = event.get_value_or_default<HT_ThreadId>("thread_id", 0u);
    HT_TimestampNs start_ts = event.get_timestamp();
    HT_DurationNs duration = event.get_value_or_default<HT_DurationNs>("duration", 0u);
    _events[thread_id].emplace_back(label, start_ts, duration);
}